

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O2

void __thiscall QHttp2Connection::handlePING(QHttp2Connection *this)

{
  QHttp2Connection *this_00;
  QHttp2Connection *this_01;
  __optional_ne_t<QByteArrayView,_QByteArray> _Var1;
  quint32 qVar2;
  FrameFlags FVar3;
  uchar *begin;
  uchar *puVar4;
  QIODevice *pQVar5;
  void *__buf;
  char *pcVar6;
  long in_FS_OFFSET;
  char local_58 [24];
  char *local_40;
  QByteArrayView local_38;
  size_t local_28;
  
  local_28 = *(size_t *)(in_FS_OFFSET + 0x28);
  this_00 = this + 0x238;
  qVar2 = Http2::Frame::streamID((Frame *)this_00);
  if (qVar2 != 0) {
    if (*(size_t *)(in_FS_OFFSET + 0x28) == local_28) {
      connectionError(this,PROTOCOL_ERROR,"PING on invalid stream");
      return;
    }
    goto LAB_001d8c2b;
  }
  FVar3 = Http2::Frame::flags((Frame *)this_00);
  if (((uint)FVar3.super_QFlagsStorageHelper<Http2::FrameFlag,_4>.
             super_QFlagsStorage<Http2::FrameFlag>.i & 1) == 0) {
    pingFrameRecived(this,Ping);
    this_01 = this + 0x250;
    Http2::FrameWriter::start((FrameWriter *)this_01,PING,(FrameFlags)0x1,0);
    begin = Http2::Frame::dataBegin((Frame *)this_00);
    puVar4 = Http2::Frame::dataBegin((Frame *)this_00);
    Http2::FrameWriter::append((FrameWriter *)this_01,begin,puVar4 + 8);
    pQVar5 = getSocket(this);
    if (*(size_t *)(in_FS_OFFSET + 0x28) == local_28) {
      Http2::FrameWriter::write
                ((FrameWriter *)this_01,(int)pQVar5,__buf,*(size_t *)(in_FS_OFFSET + 0x28));
      return;
    }
    goto LAB_001d8c2b;
  }
  local_38.m_data = (storage_type *)Http2::Frame::dataBegin((Frame *)this_00);
  local_38.m_size = 8;
  if (this[0x208] == (QHttp2Connection)0x0) {
    pingFrameRecived(this,PongNoPingSent);
    qHttp2ConnectionLog();
    if (((byte)qHttp2ConnectionLog::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1)
        != 0) {
      pcVar6 = "[%p] PING with ACK received but no PING was sent.";
LAB_001d8bf0:
      local_58[0x14] = '\0';
      local_58[0x15] = '\0';
      local_58[0x16] = '\0';
      local_58[0x17] = '\0';
      local_58[0xc] = '\0';
      local_58[0xd] = '\0';
      local_58[0xe] = '\0';
      local_58[0xf] = '\0';
      local_58[0x10] = '\0';
      local_58[0x11] = '\0';
      local_58[0x12] = '\0';
      local_58[0x13] = '\0';
      local_58[4] = '\0';
      local_58[5] = '\0';
      local_58[6] = '\0';
      local_58[7] = '\0';
      local_58[8] = '\0';
      local_58[9] = '\0';
      local_58[10] = '\0';
      local_58[0xb] = '\0';
      local_58[0] = '\x02';
      local_58[1] = '\0';
      local_58[2] = '\0';
      local_58[3] = '\0';
      local_40 = qHttp2ConnectionLog::category.name;
      QMessageLogger::warning(local_58,pcVar6,this);
    }
  }
  else {
    _Var1 = std::operator!=(&local_38,(optional<QByteArray> *)(this + 0x1f0));
    if (_Var1) {
      pingFrameRecived(this,PongSignatureChanged);
      qHttp2ConnectionLog();
      if (((byte)qHttp2ConnectionLog::category.field_2.bools.enabledWarning._q_value._M_base._M_i &
          1) != 0) {
        pcVar6 = "[%p] PING signature does not match the last PING.";
        goto LAB_001d8bf0;
      }
    }
    else {
      pingFrameRecived(this,PongSignatureIdentical);
    }
  }
  std::_Optional_payload_base<QByteArray>::_M_reset
            ((_Optional_payload_base<QByteArray> *)(this + 0x1f0));
  if (*(size_t *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_001d8c2b:
  __stack_chk_fail();
}

Assistant:

void QHttp2Connection::handlePING()
{
    Q_ASSERT(inboundFrame.type() == FrameType::PING);

    // RFC 9113, 6.7: PING frames are not associated with any individual stream. If a PING frame is
    // received with a Stream Identifier field value other than 0x00, the recipient MUST respond
    // with a connection error
    if (inboundFrame.streamID() != connectionStreamID)
        return connectionError(PROTOCOL_ERROR, "PING on invalid stream");

    // Receipt of a PING frame with a length field value other than 8 MUST be treated
    // as a connection error (Section 5.4.1) of type FRAME_SIZE_ERROR.
    // checked in Frame::validateHeader()
    Q_ASSERT(inboundFrame.payloadSize() == 8);

    if (inboundFrame.flags() & FrameFlag::ACK) {
        QByteArrayView pingSignature(reinterpret_cast<const char *>(inboundFrame.dataBegin()), 8);
        if (!m_lastPingSignature.has_value()) {
            emit pingFrameRecived(PingState::PongNoPingSent);
            qCWarning(qHttp2ConnectionLog, "[%p] PING with ACK received but no PING was sent.", this);
        } else if (pingSignature != m_lastPingSignature) {
            emit pingFrameRecived(PingState::PongSignatureChanged);
            qCWarning(qHttp2ConnectionLog, "[%p] PING signature does not match the last PING.", this);
        } else {
            emit pingFrameRecived(PingState::PongSignatureIdentical);
        }
        m_lastPingSignature.reset();
        return;
    } else {
        emit pingFrameRecived(PingState::Ping);

    }


    frameWriter.start(FrameType::PING, FrameFlag::ACK, connectionStreamID);
    frameWriter.append(inboundFrame.dataBegin(), inboundFrame.dataBegin() + 8);
    frameWriter.write(*getSocket());
}